

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

int32_t decShiftToMost(uint8_t *uar,int32_t digits,int32_t shift)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint local_7c;
  uint local_6c;
  uint local_64;
  uint local_54;
  uint32_t rem;
  uint32_t quot;
  uint32_t next;
  int32_t cut;
  uint8_t *first;
  uint8_t *source;
  uint8_t *target;
  int32_t shift_local;
  int32_t digits_local;
  uint8_t *uar_local;
  
  uar_local._4_4_ = digits;
  if (shift != 0) {
    if (digits + shift < 2) {
      *uar = *uar * (char)DECPOWERS[shift];
      uar_local._4_4_ = digits + shift;
    }
    else {
      rem = 0;
      if (digits < 0x32) {
        local_54 = (uint)""[digits];
      }
      else {
        local_54 = digits / 1;
      }
      first = uar + (long)(int)local_54 + -1;
      if (shift < 0x32) {
        local_64 = (uint)""[shift];
      }
      else {
        local_64 = shift / 1;
      }
      source = first + (int)local_64;
      if (shift < 0x32) {
        local_6c = (uint)""[shift];
      }
      else {
        local_6c = shift / 1;
      }
      iVar3 = 1 - (shift - (local_6c - 1));
      if (iVar3 == 0) {
        for (; uar <= first; first = first + -1) {
          *source = *first;
          source = source + -1;
        }
      }
      else {
        if (digits + shift < 0x32) {
          local_7c = (uint)""[digits + shift];
        }
        else {
          local_7c = (digits + shift) / 1;
        }
        for (; uar <= first; first = first + -1) {
          uVar4 = (uint)(*first >> ((byte)iVar3 & 0x1f)) * multies[iVar3] >> 0x11;
          bVar1 = *first;
          uVar2 = DECPOWERS[iVar3];
          if (source <= uar + (long)(int)local_7c + -1) {
            *source = (char)uVar4 + (char)rem;
          }
          rem = ((uint)bVar1 - uVar4 * uVar2) * DECPOWERS[1 - iVar3];
          source = source + -1;
        }
      }
      for (; uar <= source; source = source + -1) {
        *source = (uint8_t)rem;
        rem = 0;
      }
      uar_local._4_4_ = digits + shift;
    }
  }
  return uar_local._4_4_;
}

Assistant:

static Int decShiftToMost(Unit *uar, Int digits, Int shift) {
  Unit  *target, *source, *first;  /* work  */
  Int   cut;                       /* odd 0's to add  */
  uInt  next;                      /* work  */

  if (shift==0) return digits;     /* [fastpath] nothing to do  */
  if ((digits+shift)<=DECDPUN) {   /* [fastpath] single-unit case  */
    *uar=(Unit)(*uar*powers[shift]);
    return digits+shift;
    }

  next=0;                          /* all paths  */
  source=uar+D2U(digits)-1;        /* where msu comes from  */
  target=source+D2U(shift);        /* where upper part of first cut goes  */
  cut=DECDPUN-MSUDIGITS(shift);    /* where to slice  */
  if (cut==0) {                    /* unit-boundary case  */
    for (; source>=uar; source--, target--) *target=*source;
    }
   else {
    first=uar+D2U(digits+shift)-1; /* where msu of source will end up  */
    for (; source>=uar; source--, target--) {
      /* split the source Unit and accumulate remainder for next  */
      #if DECDPUN<=4
        uInt quot=QUOT10(*source, cut);
        uInt rem=*source-quot*powers[cut];
        next+=quot;
      #else
        uInt rem=*source%powers[cut];
        next+=*source/powers[cut];
      #endif
      if (target<=first) *target=(Unit)next;   /* write to target iff valid  */
      next=rem*powers[DECDPUN-cut];            /* save remainder for next Unit  */
      }
    } /* shift-move  */

  /* propagate any partial unit to one below and clear the rest  */
  for (; target>=uar; target--) {
    *target=(Unit)next;
    next=0;
    }
  return digits+shift;
  }